

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O2

int __thiscall QDockWidgetPrivate::init(QDockWidgetPrivate *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  QWidget *parent;
  Data *pDVar2;
  QWidgetData *pQVar3;
  char16_t *pcVar4;
  QDockWidgetLayout *this_00;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar5;
  QAction *this_01;
  long in_FS_OFFSET;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  Object local_88 [8];
  QArrayDataPointer<char16_t> local_80;
  undefined1 local_68 [16];
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  parent = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  this_00 = (QDockWidgetLayout *)operator_new(0x48);
  QDockWidgetLayout::QDockWidgetLayout(this_00,parent);
  QLayout::setSizeConstraint((QLayout *)this_00,SetMinAndMaxSize);
  aVar5.m_data = operator_new(0x30);
  QDockWidgetTitleButton::QDockWidgetTitleButton
            ((QDockWidgetTitleButton *)aVar5.m_data,(QDockWidget *)parent);
  QVar6.m_size = (size_t)"qt_dockwidget_floatbutton";
  QVar6.field_0.m_data = aVar5.m_data;
  QObject::setObjectName(QVar6);
  local_58.d = (Data *)toggleTopLevel;
  local_58.ptr = (char16_t *)0x0;
  QObjectPrivate::connect<void(QAbstractButton::*)(bool),void(QDockWidgetPrivate::*)()>
            ((Object *)(local_68 + 8),(offset_in_QAbstractButton_to_subr)aVar5,
             (Object *)QAbstractButton::clicked,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)(local_68 + 8));
  QDockWidgetLayout::setWidgetForRole(this_00,FloatButton,(QWidget *)aVar5.m_data);
  aVar5.m_data = operator_new(0x30);
  QDockWidgetTitleButton::QDockWidgetTitleButton
            ((QDockWidgetTitleButton *)aVar5.m_data,(QDockWidget *)parent);
  QVar7.m_size = (size_t)"qt_dockwidget_closebutton";
  QVar7.field_0.m_data = aVar5.m_data;
  QObject::setObjectName(QVar7);
  local_58.d = (Data *)QWidget::close;
  local_58.ptr = (char16_t *)0x0;
  QObject::connect<void(QAbstractButton::*)(bool),bool(QWidget::*)()>
            ((Object *)local_68,(offset_in_QAbstractButton_to_subr)aVar5,
             (ContextType *)QAbstractButton::clicked,(offset_in_QWidget_to_subr *)0x0,
             (ConnectionType)parent);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  QDockWidgetLayout::setWidgetForRole(this_00,CloseButton,(QWidget *)aVar5.m_data);
  QApplication::font((QApplication *)&local_58,"QDockWidgetTitle");
  pDVar2 = *(Data **)&this->font;
  *(Data **)&this->font = local_58.d;
  uVar1 = *(undefined4 *)&this->field_0x270;
  *(undefined4 *)&this->field_0x270 = local_58.ptr._0_4_;
  local_58.ptr = (char16_t *)CONCAT44(local_58.ptr._4_4_,uVar1);
  local_58.d = pDVar2;
  QFont::~QFont((QFont *)&local_58);
  this_01 = (QAction *)operator_new(0x10);
  QAction::QAction(this_01,&parent->super_QObject);
  this->toggleViewAction = this_01;
  QAction::setCheckable(SUB81(this_01,0));
  QAction::setMenuRole((MenuRole)this->toggleViewAction);
  QWidget::windowTitle((QString *)&local_80,parent);
  qt_setWindowTitle_helperHelper((QString *)&local_58,(QString *)&local_80,parent);
  pDVar2 = (this->fixedWindowTitle).d.d;
  pcVar4 = (this->fixedWindowTitle).d.ptr;
  (this->fixedWindowTitle).d.d = local_58.d;
  (this->fixedWindowTitle).d.ptr = local_58.ptr;
  pQVar3 = (QWidgetData *)(this->fixedWindowTitle).d.size;
  (this->fixedWindowTitle).d.size = local_58.size;
  local_58.d = pDVar2;
  local_58.ptr = pcVar4;
  local_58.size = (qsizetype)pQVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  QAction::setText((QString *)this->toggleViewAction);
  local_58.d = (Data *)toggleView;
  local_58.ptr = (char16_t *)0x0;
  QObjectPrivate::connect<void(QAction::*)(bool),void(QDockWidgetPrivate::*)(bool)>
            (local_88,(offset_in_QAction_to_subr)this->toggleViewAction,(Object *)QAction::triggered
             ,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_88);
  updateButtons(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QDockWidgetPrivate::init()
{
    Q_Q(QDockWidget);

    QDockWidgetLayout *layout = new QDockWidgetLayout(q);
    layout->setSizeConstraint(QLayout::SetMinAndMaxSize);

    QAbstractButton *button = new QDockWidgetTitleButton(q);
    button->setObjectName("qt_dockwidget_floatbutton"_L1);
    QObjectPrivate::connect(button, &QAbstractButton::clicked,
                            this, &QDockWidgetPrivate::toggleTopLevel);
    layout->setWidgetForRole(QDockWidgetLayout::FloatButton, button);

    button = new QDockWidgetTitleButton(q);
    button->setObjectName("qt_dockwidget_closebutton"_L1);
    QObject::connect(button, &QAbstractButton::clicked, q, &QDockWidget::close);
    layout->setWidgetForRole(QDockWidgetLayout::CloseButton, button);

    font = QApplication::font("QDockWidgetTitle");

#ifndef QT_NO_ACTION
    toggleViewAction = new QAction(q);
    toggleViewAction->setCheckable(true);
    toggleViewAction->setMenuRole(QAction::NoRole);
    fixedWindowTitle = qt_setWindowTitle_helperHelper(q->windowTitle(), q);
    toggleViewAction->setText(fixedWindowTitle);
    QObjectPrivate::connect(toggleViewAction, &QAction::triggered,
                            this, &QDockWidgetPrivate::toggleView);
#endif

    updateButtons();
}